

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# point_cloud_encoder.cc
# Opt level: O2

bool __thiscall draco::PointCloudEncoder::EncodeAllAttributes(PointCloudEncoder *this)

{
  int *piVar1;
  __uniq_ptr_impl<draco::AttributesEncoder,_std::default_delete<draco::AttributesEncoder>_> _Var2;
  int *piVar3;
  char cVar4;
  int *piVar5;
  
  piVar1 = (this->attributes_encoder_ids_order_).super__Vector_base<int,_std::allocator<int>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  piVar3 = (this->attributes_encoder_ids_order_).super__Vector_base<int,_std::allocator<int>_>.
           _M_impl.super__Vector_impl_data._M_start;
  do {
    piVar5 = piVar3;
    if (piVar5 == piVar1) break;
    _Var2._M_t.
    super__Tuple_impl<0UL,_draco::AttributesEncoder_*,_std::default_delete<draco::AttributesEncoder>_>
    .super__Head_base<0UL,_draco::AttributesEncoder_*,_false>._M_head_impl =
         (this->attributes_encoders_).
         super__Vector_base<std::unique_ptr<draco::AttributesEncoder,_std::default_delete<draco::AttributesEncoder>_>,_std::allocator<std::unique_ptr<draco::AttributesEncoder,_std::default_delete<draco::AttributesEncoder>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start[*piVar5]._M_t.
         super___uniq_ptr_impl<draco::AttributesEncoder,_std::default_delete<draco::AttributesEncoder>_>
         ._M_t;
    cVar4 = (**(code **)(*(long *)_Var2._M_t.
                                  super__Tuple_impl<0UL,_draco::AttributesEncoder_*,_std::default_delete<draco::AttributesEncoder>_>
                                  .super__Head_base<0UL,_draco::AttributesEncoder_*,_false>.
                                  _M_head_impl + 0x28))
                      (_Var2._M_t.
                       super__Tuple_impl<0UL,_draco::AttributesEncoder_*,_std::default_delete<draco::AttributesEncoder>_>
                       .super__Head_base<0UL,_draco::AttributesEncoder_*,_false>._M_head_impl,
                       this->buffer_);
    piVar3 = piVar5 + 1;
  } while (cVar4 != '\0');
  return piVar5 == piVar1;
}

Assistant:

bool PointCloudEncoder::EncodeAllAttributes() {
  for (int att_encoder_id : attributes_encoder_ids_order_) {
    if (!attributes_encoders_[att_encoder_id]->EncodeAttributes(buffer_)) {
      return false;
    }
  }
  return true;
}